

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O1

void save_json(path *root,string_view filename,json *dbjson)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  size_type *psVar5;
  string tmp_db_name;
  path __result_1;
  ofstream db_file;
  undefined1 auStack_318 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  path local_2f0;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  path local_2a0;
  path local_260;
  undefined1 local_220 [8];
  size_type local_218;
  undefined8 uStack_210;
  undefined4 auStack_204 [55];
  ios_base local_128 [264];
  
  local_2b0._M_str = filename._M_str;
  local_2b0._M_len = filename._M_len;
  random_hex_string_abi_cxx11_(&local_2a0._M_pathname,8);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x1af3b6);
  paVar1 = &local_2f0._M_pathname.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_2f0._M_pathname.field_2._M_allocated_capacity = *psVar5;
    local_2f0._M_pathname.field_2._8_8_ = plVar3[3];
    local_2f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f0._M_pathname.field_2._M_allocated_capacity = *psVar5;
    local_2f0._M_pathname._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_2f0._M_pathname._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::experimental::filesystem::v1::__cxx11::path::path(&local_260,&local_2f0._M_pathname);
  std::experimental::filesystem::v1::__cxx11::path::path((path *)local_220,root);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)local_220,&local_260._M_pathname);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_220,(pointer)((long)local_220 + local_218));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_220);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f0._M_pathname._M_dataplus._M_p,
                    local_2f0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_pathname._M_dataplus._M_p != &local_2a0._M_pathname.field_2) {
    operator_delete(local_2a0._M_pathname._M_dataplus._M_p,
                    local_2a0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_220);
  lVar2 = *(long *)((long)local_220 + -0x18);
  *(undefined4 *)((long)auStack_204 + lVar2) = 1;
  std::ios::clear((int)auStack_318 + (int)lVar2 + 0xf8);
  std::ofstream::open((string *)local_220,(_Ios_Openmode)&local_310);
  *(undefined8 *)((long)&uStack_210 + *(long *)((long)local_220 + -0x18)) = 4;
  poVar4 = nlohmann::operator<<((ostream *)local_220,dbjson);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ostream::flush();
  std::ofstream::close();
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_260,&local_310)
  ;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_2a0,&local_2b0);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_2f0,root);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_2f0,&local_2a0._M_pathname);
  std::experimental::filesystem::v1::rename(&local_260,&local_2f0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2f0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2a0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_260);
  local_220 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = _seekpos;
  std::filebuf::~filebuf((filebuf *)&local_218);
  std::ios_base::~ios_base(local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void save_json(const fs::path &root, std::string_view filename,
               const json &dbjson) {
    std::string tmp_db_name = root / ("upgrade." + random_hex_string(8));
    std::ofstream db_file;
    db_file.exceptions(std::ofstream::badbit);
    db_file.open(tmp_db_name, std::ofstream::binary);
    db_file << std::setw(4) << dbjson << std::endl;
    db_file.flush();
    db_file.close();
    fs::rename(tmp_db_name, root / filename);
}